

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

void Abc_FlowRetime_UpdateLags(void)

{
  Abc_Ntk_t *pAVar1;
  ulong uVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  uint nCapMin;
  int iVar5;
  long lVar6;
  
  pAVar1 = pManMR->pNtk;
  if ((pAVar1->vTravIds).pArray == (int *)0x0) {
    nCapMin = pAVar1->vObjs->nSize + 500;
    Vec_IntGrow(&pAVar1->vTravIds,nCapMin);
    uVar2 = 0;
    uVar4 = 0;
    if (0 < (int)nCapMin) {
      uVar4 = (ulong)nCapMin;
    }
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      (pAVar1->vTravIds).pArray[uVar2] = 0;
    }
    (pAVar1->vTravIds).nSize = nCapMin;
  }
  iVar5 = pAVar1->nTravIds;
  pAVar1->nTravIds = iVar5 + 1;
  if (iVar5 < 0x3fffffff) {
    for (iVar5 = 0; iVar5 < pManMR->pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkBox(pManMR->pNtk,iVar5);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
        if (pManMR->fIsForward == 0) {
          for (lVar6 = 0; lVar6 < (pAVar3->vFanouts).nSize; lVar6 = lVar6 + 1) {
            Abc_FlowRetime_UpdateLags_back_rec
                      ((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanouts).pArray[lVar6]]);
          }
        }
        else {
          for (lVar6 = 0; lVar6 < (pAVar3->vFanins).nSize; lVar6 = lVar6 + 1) {
            Abc_FlowRetime_UpdateLags_forw_rec
                      ((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar6]]);
          }
        }
      }
    }
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void
Abc_FlowRetime_UpdateLags( ) {
  Abc_Obj_t *pObj, *pNext;
  int i, j;

  Abc_NtkIncrementTravId( pManMR->pNtk );

  Abc_NtkForEachLatch( pManMR->pNtk, pObj, i )
    if (pManMR->fIsForward) {
      Abc_ObjForEachFanin( pObj, pNext, j )          
        Abc_FlowRetime_UpdateLags_forw_rec( pNext );
    } else {
      Abc_ObjForEachFanout( pObj, pNext, j )          
        Abc_FlowRetime_UpdateLags_back_rec( pNext );
    }
}